

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Client_connect(UA_Client *client,char *endpointUrl)

{
  size_t sVar1;
  UA_ConnectionConfig UVar2;
  UA_UInt32 UVar3;
  UA_UInt32 UVar4;
  UA_StatusCode UVar5;
  int iVar6;
  UA_UInt32 UVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 uVar8;
  void *dst;
  long lVar9;
  char *msg;
  long lVar10;
  UA_UserTokenPolicy *src;
  undefined1 auVar11 [8];
  size_t sVar12;
  UA_EndpointDescription *pUVar13;
  size_t sVar14;
  UA_String UVar15;
  undefined1 local_2d0 [8];
  timeval tv;
  undefined1 local_230 [136];
  undefined1 auStack_1a8 [8];
  UA_EndpointDescription *endpointArray;
  UA_UInt32 local_198;
  UA_UInt32 UStack_194;
  undefined1 auStack_190 [32];
  UA_Int32 local_170;
  undefined4 local_f8;
  undefined8 local_f0;
  void *local_e8;
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined8 local_70;
  undefined4 local_68;
  UA_String *local_60;
  size_t local_58;
  undefined8 local_50;
  ulong local_48;
  UA_EndpointDescription *local_40;
  UA_UserTokenPolicy *local_38;
  
  if (client->state == UA_CLIENTSTATE_CONNECTED) {
    return 0;
  }
  if (client->state == UA_CLIENTSTATE_ERRORED) {
    UA_Client_deleteMembers(client);
    auStack_1a8 = *(undefined1 (*) [8])&client->config;
    endpointArray = (UA_EndpointDescription *)(client->config).logger;
    local_198 = (client->config).localConnectionConfig.protocolVersion;
    UStack_194 = (client->config).localConnectionConfig.sendBufferSize;
    auStack_190._0_4_ = (client->config).localConnectionConfig.recvBufferSize;
    auStack_190._4_4_ = (client->config).localConnectionConfig.maxMessageSize;
    auStack_190._8_8_ = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
    auStack_190._16_8_ = (client->config).connectionFunc;
    memset(client,0,600);
    (client->channel).connection = &client->connection;
    (client->config).timeout = auStack_1a8._0_4_;
    (client->config).secureChannelLifeTime = auStack_1a8._4_4_;
    (client->config).logger = (UA_Logger)endpointArray;
    (client->config).localConnectionConfig.protocolVersion = local_198;
    (client->config).localConnectionConfig.sendBufferSize = UStack_194;
    (client->config).localConnectionConfig.recvBufferSize = auStack_190._0_4_;
    (client->config).localConnectionConfig.maxMessageSize = auStack_190._4_4_;
    *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = auStack_190._8_8_;
    (client->config).connectionFunc = (UA_ConnectClientConnection)auStack_190._16_8_;
  }
  UVar2.recvBufferSize = 0xffff;
  UVar2.maxMessageSize = 0;
  UVar2.protocolVersion = 0;
  UVar2.sendBufferSize = 0xffff;
  UVar2.maxChunkCount = 0;
  (*(client->config).connectionFunc)
            ((UA_Connection *)auStack_1a8,UVar2,endpointUrl,(client->config).logger);
  memcpy(&client->connection,(UA_Connection *)auStack_1a8,0x88);
  UVar5 = 0x80ae0000;
  if ((client->connection).state == UA_CONNECTION_OPENING) {
    UVar15 = UA_String_fromChars(endpointUrl);
    client->endpointUrl = UVar15;
    if (UVar15.data == (UA_Byte *)0x0) {
      UVar5 = 0x80030000;
    }
    else {
      (client->connection).localConf.maxChunkCount =
           (client->config).localConnectionConfig.maxChunkCount;
      UVar7 = (client->config).localConnectionConfig.sendBufferSize;
      UVar3 = (client->config).localConnectionConfig.recvBufferSize;
      UVar4 = (client->config).localConnectionConfig.maxMessageSize;
      (client->connection).localConf.protocolVersion =
           (client->config).localConnectionConfig.protocolVersion;
      (client->connection).localConf.sendBufferSize = UVar7;
      (client->connection).localConf.recvBufferSize = UVar3;
      (client->connection).localConf.maxMessageSize = UVar4;
      UVar5 = HelAckHandshake(client);
      if ((UVar5 == 0) && (UVar5 = SecureChannelHandshake(client,false), UVar5 == 0)) {
        auStack_1a8 = (undefined1  [8])0x0;
        local_2d0 = (undefined1  [8])0x0;
        UVar5 = GetEndpoints(client,(size_t *)local_2d0,(UA_EndpointDescription **)auStack_1a8);
        if (UVar5 == 0) {
          local_58 = (size_t)local_2d0;
          if (local_2d0 == (undefined1  [8])0x0) {
            UA_Array_delete((void *)auStack_1a8,0,UA_TYPES + 0x9b);
            msg = "No suitable endpoint found";
          }
          else {
            local_60 = &client->endpointUrl;
            local_38 = &client->token;
            sVar14 = 0;
            local_50 = 0;
            local_48 = 0;
            local_40 = (UA_EndpointDescription *)auStack_1a8;
            auVar11 = auStack_1a8;
            do {
              sVar12 = (((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->
                       transportProfileUri).length;
              pUVar13 = (UA_EndpointDescription *)auVar11;
              if (((sVar12 == 0) ||
                  ((sVar12 == 0x41 &&
                   (iVar6 = bcmp((((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->
                                 transportProfileUri).data,
                                 "http://opcfoundation.org/UA-Profile/Transport/uatcp-uasc-uabinary"
                                 ,0x41), iVar6 == 0)))) &&
                 ((((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->securityPolicyUri).
                  length == 0x2f)) {
                iVar6 = bcmp((((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->
                             securityPolicyUri).data,
                             "http://opcfoundation.org/UA/SecurityPolicy#None",0x2f);
                if (iVar6 == 0) {
                  sVar12 = ((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->
                           userIdentityTokensSize;
                  local_48 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
                  pUVar13 = local_40;
                  if (sVar12 != 0) {
                    src = ((UA_EndpointDescription *)((long)auVar11 + sVar14 * 0xd8))->
                          userIdentityTokens;
                    do {
                      sVar1 = (src->securityPolicyUri).length;
                      if (((sVar1 == 0) ||
                          ((sVar1 == 0x2f &&
                           (iVar6 = bcmp((src->securityPolicyUri).data,
                                         "http://opcfoundation.org/UA/SecurityPolicy#None",0x2f),
                           iVar6 == 0)))) && (client->authenticationMethod == src->tokenType)) {
                        UVar5 = UA_copy(src,local_38,UA_TYPES + 0x65);
                        uVar8 = (undefined7)(CONCAT44(extraout_var_00,UVar5) >> 8);
                        local_48 = CONCAT71(uVar8,1);
                        local_50 = CONCAT71(uVar8,1);
                        pUVar13 = local_40;
                        break;
                      }
                      src = src + 1;
                      sVar12 = sVar12 - 1;
                      pUVar13 = local_40;
                    } while (sVar12 != 0);
                  }
                }
              }
              sVar14 = sVar14 + 1;
              auVar11 = (undefined1  [8])pUVar13;
            } while (sVar14 != local_58);
            UA_Array_delete(pUVar13,local_58,UA_TYPES + 0x9b);
            msg = "No suitable endpoint found";
            if ((local_48 & 1) != 0) {
              msg = "No suitable UserTokenPolicy found for the possible endpoints";
            }
            if (((byte)local_50 & (byte)local_48 & 1) != 0) {
              memset(auStack_1a8,0,0x148);
              gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
              auStack_190._0_8_ =
                   (long)local_2d0 * 10000000 + CONCAT44(tv.tv_sec._4_4_,(undefined4)tv.tv_sec) * 10
                   + 0x19db1ded53e8000;
              local_170 = 10000;
              UA_copy(&(client->channel).clientNonce,local_90,UA_TYPES + 0xe);
              local_70 = 0x41324f8000000000;
              local_68 = 0x7fffffff;
              UA_copy(local_60,local_b0,UA_TYPES + 0xb);
              memset(local_2d0,0,0x128);
              __UA_Client_Service(client,auStack_1a8,UA_TYPES + 0x99,local_2d0,UA_TYPES + 0xa1);
              UA_copy(local_230,&client->authenticationToken,UA_TYPES + 0x10);
              UVar5 = tv.tv_sec._4_4_;
              deleteMembers_noInit(auStack_1a8,UA_TYPES + 0x99);
              memset(auStack_1a8,0,0x148);
              deleteMembers_noInit(local_2d0,UA_TYPES + 0xa1);
              if (UVar5 == 0) {
                memset(auStack_1a8,0,0x100);
                UVar7 = client->requestHandle + 1;
                client->requestHandle = UVar7;
                auStack_190._8_4_ = UVar7;
                gettimeofday((timeval *)local_2d0,(__timezone_ptr_t)0x0);
                auStack_190._0_8_ =
                     (long)local_2d0 * 10000000 + 0x19db1ded53e8000 +
                     CONCAT44(tv.tv_sec._4_4_,(undefined4)tv.tv_sec) * 10;
                local_170 = 600000;
                if (client->authenticationMethod == UA_CLIENTAUTHENTICATION_NONE) {
                  dst = calloc(1,0x10);
                  UA_copy(local_38,dst,UA_TYPES + 0xb);
                  local_f0 = 0x13ec20;
                }
                else {
                  dst = calloc(1,0x40);
                  UA_copy(local_38,dst,UA_TYPES + 0xb);
                  UA_copy(&client->username,(void *)((long)dst + 0x10),UA_TYPES + 0xb);
                  UA_copy(&client->password,(void *)((long)dst + 0x20),UA_TYPES + 0xb);
                  local_f0 = 0x13f2b0;
                }
                local_f8 = 3;
                local_e8 = dst;
                __UA_Client_Service(client,auStack_1a8,UA_TYPES + 0x53,local_2d0,UA_TYPES + 0x58);
                if (tv.tv_sec._4_4_ == 0) {
                  UVar5 = 0;
                }
                else {
                  lVar10 = 0;
                  lVar9 = 0x141ba0;
                  do {
                    if (*(UA_StatusCode *)((long)&statusCodeDescriptions[0].code + lVar10) ==
                        tv.tv_sec._4_4_) {
                      lVar9 = (long)&statusCodeDescriptions[0].code + lVar10;
                      break;
                    }
                    lVar10 = lVar10 + 0x18;
                  } while (lVar10 != 0x1578);
                  UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,
                               "ActivateSession failed with error code %s",
                               *(undefined8 *)(lVar9 + 8));
                  UVar5 = tv.tv_sec._4_4_;
                }
                deleteMembers_noInit(auStack_1a8,UA_TYPES + 0x53);
                memset(auStack_1a8,0,0x100);
                deleteMembers_noInit(local_2d0,UA_TYPES + 0x58);
                if (UVar5 == 0) {
                  (client->connection).state = UA_CONNECTION_ESTABLISHED;
                  client->state = UA_CLIENTSTATE_CONNECTED;
                  return 0;
                }
              }
              goto LAB_001269f7;
            }
          }
          UA_LOG_ERROR((client->config).logger,UA_LOGCATEGORY_CLIENT,msg);
          UVar5 = 0x80020000;
        }
      }
    }
  }
LAB_001269f7:
  UA_Client_deleteMembers(client);
  auStack_1a8 = *(undefined1 (*) [8])&client->config;
  endpointArray = (UA_EndpointDescription *)(client->config).logger;
  local_198 = (client->config).localConnectionConfig.protocolVersion;
  UStack_194 = (client->config).localConnectionConfig.sendBufferSize;
  auStack_190._0_4_ = (client->config).localConnectionConfig.recvBufferSize;
  auStack_190._4_4_ = (client->config).localConnectionConfig.maxMessageSize;
  auStack_190._8_8_ = *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount;
  auStack_190._16_8_ = (client->config).connectionFunc;
  memset(client,0,600);
  (client->channel).connection = &client->connection;
  (client->config).timeout = auStack_1a8._0_4_;
  (client->config).secureChannelLifeTime = auStack_1a8._4_4_;
  (client->config).logger = (UA_Logger)endpointArray;
  (client->config).localConnectionConfig.protocolVersion = local_198;
  (client->config).localConnectionConfig.sendBufferSize = UStack_194;
  (client->config).localConnectionConfig.recvBufferSize = auStack_190._0_4_;
  (client->config).localConnectionConfig.maxMessageSize = auStack_190._4_4_;
  *(undefined8 *)&(client->config).localConnectionConfig.maxChunkCount = auStack_190._8_8_;
  (client->config).connectionFunc = (UA_ConnectClientConnection)auStack_190._16_8_;
  return UVar5;
}

Assistant:

UA_StatusCode
UA_Client_connect(UA_Client *client, const char *endpointUrl) {
    if(client->state == UA_CLIENTSTATE_CONNECTED)
        return UA_STATUSCODE_GOOD;
    if(client->state == UA_CLIENTSTATE_ERRORED) {
        UA_Client_reset(client);
    }

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    client->connection =
        client->config.connectionFunc(UA_ConnectionConfig_standard,
                                      endpointUrl, client->config.logger);
    if(client->connection.state != UA_CONNECTION_OPENING) {
        retval = UA_STATUSCODE_BADCONNECTIONCLOSED;
        goto cleanup;
    }

    client->endpointUrl = UA_STRING_ALLOC(endpointUrl);
    if(!client->endpointUrl.data) {
        retval = UA_STATUSCODE_BADOUTOFMEMORY;
        goto cleanup;
    }

    client->connection.localConf = client->config.localConnectionConfig;
    retval = HelAckHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SecureChannelHandshake(client, false);
    if(retval == UA_STATUSCODE_GOOD)
        retval = EndpointsHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = SessionHandshake(client);
    if(retval == UA_STATUSCODE_GOOD)
        retval = ActivateSession(client);
    if(retval == UA_STATUSCODE_GOOD) {
        client->connection.state = UA_CONNECTION_ESTABLISHED;
        client->state = UA_CLIENTSTATE_CONNECTED;
    } else {
        goto cleanup;
    }
    return retval;

 cleanup:
    UA_Client_reset(client);
    return retval;
}